

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O3

shared_ptr<duckdb::Binder,_true> __thiscall
duckdb::Binder::CreateBinder
          (Binder *this,ClientContext *context,optional_ptr<duckdb::Binder,_true> parent,
          BinderType binder_type)

{
  element_type *ptr;
  optional_ptr<duckdb::Binder,_true> oVar1;
  Binder *this_00;
  BinderException *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  ulong uVar3;
  shared_ptr<duckdb::Binder,_true> sVar4;
  optional_ptr<duckdb::Binder,_true> local_60;
  enable_shared_from_this<duckdb::Binder> local_58;
  string local_48;
  
  local_60.ptr = parent.ptr;
  if (parent.ptr == (Binder *)0x0) {
    this_00 = (Binder *)operator_new(0x3b0);
  }
  else {
    optional_ptr<duckdb::Binder,_true>::CheckValid(&local_60);
    if (((local_60.ptr)->parent).internal.
        super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0
       ) {
      uVar3 = 1;
    }
    else {
      uVar3 = 1;
      oVar1 = local_60;
      do {
        uVar3 = uVar3 + 1;
        oVar1.ptr = shared_ptr<duckdb::Binder,_true>::operator*(&(oVar1.ptr)->parent);
      } while (((oVar1.ptr)->parent).internal.
               super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
               (element_type *)0x0);
    }
    oVar1.ptr = local_60.ptr;
    if ((context->config).max_expression_depth < uVar3) {
      this_01 = (BinderException *)__cxa_allocate_exception(0x10);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,
                 "Max expression depth limit of %lld exceeded. Use \"SET max_expression_depth TO x\" to increase the maximum expression depth."
                 ,"");
      BinderException::BinderException<unsigned_long>
                (this_01,&local_48,(context->config).max_expression_depth);
      __cxa_throw(this_01,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    this_00 = (Binder *)operator_new(0x3b0);
    if (oVar1.ptr != (type)0x0) {
      optional_ptr<duckdb::Binder,_true>::CheckValid(&local_60);
      enable_shared_from_this<duckdb::Binder>::shared_from_this(&local_58);
      goto LAB_01214240;
    }
  }
  local_58.__weak_this_.internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_58.__weak_this_.internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_01214240:
  Binder(this_00,context,(shared_ptr<duckdb::Binder,_true> *)&local_58,binder_type);
  (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<duckdb::Binder*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &(this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
              super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount,this_00);
  ptr = (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
        super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  shared_ptr<duckdb::Binder,_true>::__enable_weak_this<duckdb::Binder,_duckdb::Binder,_0>
            ((shared_ptr<duckdb::Binder,_true> *)this,
             &ptr->super_enable_shared_from_this<duckdb::Binder>,ptr);
  _Var2._M_pi = extraout_RDX;
  if (local_58.__weak_this_.internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.__weak_this_.internal.
               super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar4.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar4.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<duckdb::Binder,_true>)
         sVar4.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<Binder> Binder::CreateBinder(ClientContext &context, optional_ptr<Binder> parent, BinderType binder_type) {
	auto depth = parent ? parent->GetBinderDepth() : 0;
	if (depth > context.config.max_expression_depth) {
		throw BinderException("Max expression depth limit of %lld exceeded. Use \"SET max_expression_depth TO x\" to "
		                      "increase the maximum expression depth.",
		                      context.config.max_expression_depth);
	}
	return shared_ptr<Binder>(new Binder(context, parent ? parent->shared_from_this() : nullptr, binder_type));
}